

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::Functions::ATan2::ATan2(ATan2 *this)

{
  allocator<char> local_31;
  string local_30;
  ATan2 *local_10;
  ATan2 *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"atan",&local_31);
  CFloatFunc2::CFloatFunc2(&this->super_CFloatFunc2,&local_30,deAtan2);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_CFloatFunc2).super_FloatFunc2.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__ATan2_016c7538;
  return;
}

Assistant:

ATan2			(void) : CFloatFunc2 ("atan", deAtan2) {}